

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Declarators.cpp
# Opt level: O2

Action __thiscall
psy::C::DeclarationBinder::visitIdentifierDeclarator
          (DeclarationBinder *this,IdentifierDeclaratorSyntax *node)

{
  Action AVar1;
  Identifier *pIVar2;
  TypedefNameType *args;
  TypedefDeclarationSymbol *decl;
  Action AVar3;
  SyntaxToken SStack_58;
  
  AVar1 = SyntaxVisitor::
          visit<psy::C::SpecifierSyntax*,psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>>
                    (&this->super_SyntaxVisitor,
                     &node->attrs1_->
                      super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    );
  AVar3 = Quit;
  if (AVar1 != Quit) {
    if (((uint)this->field_7 & 1) == 0) {
      handleNonTypedefDeclarator(this,&node->super_DeclaratorSyntax);
      IdentifierDeclaratorSyntax::identifierToken(&SStack_58,node);
      pIVar2 = obtainName(this,&SStack_58);
      nameDeclarationAtTop(this,pIVar2);
      SyntaxToken::~SyntaxToken(&SStack_58);
    }
    else {
      IdentifierDeclaratorSyntax::identifierToken(&SStack_58,node);
      pIVar2 = obtainName(this,&SStack_58);
      SyntaxToken::~SyntaxToken(&SStack_58);
      args = makeType<psy::C::TypedefNameType,psy::C::Identifier_const*>(this,pIVar2);
      decl = bindDeclaration<psy::C::TypedefDeclarationSymbol,psy::C::TypedefNameType*>
                       (this,(SyntaxNode *)node,args);
      if (pIVar2 == this->ptrdiff_t_) {
        SemanticModel::set_ptrdiff_t_typedef(this->semaModel_,decl);
      }
      else if (pIVar2 == this->size_t_) {
        SemanticModel::set_size_t_typedef(this->semaModel_,decl);
      }
      else if (pIVar2 == this->max_align_t_) {
        SemanticModel::set_max_align_t_typedef(this->semaModel_,decl);
      }
      else if (pIVar2 == this->wchar_t_) {
        SemanticModel::set_wchar_t_typedef(this->semaModel_,decl);
      }
      else if (pIVar2 == this->char16_t_) {
        SemanticModel::set_char16_t_typedef(this->semaModel_,decl);
      }
      else if (pIVar2 == this->char32_t_) {
        SemanticModel::set_char32_t_typedef(this->semaModel_,decl);
      }
    }
    AVar1 = SyntaxVisitor::
            visit<psy::C::SpecifierSyntax*,psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>>
                      (&this->super_SyntaxVisitor,
                       &node->attrs2_->
                        super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                      );
    if (AVar1 != Quit) {
      AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->init_->super_SyntaxNode);
      AVar3 = (AVar1 == Quit) + Skip;
    }
  }
  return AVar3;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitIdentifierDeclarator(const IdentifierDeclaratorSyntax* node)
{
    VISIT(node->attributes());

    if (F_.inTydefDecltor_) {
        auto name = obtainName(node->identifierToken());
        auto tydefNameTy = makeType<TypedefNameType>(name);
        auto decl = bindDeclaration<TypedefDeclarationSymbol>(node, tydefNameTy);

        if (name == ptrdiff_t_)
            semaModel_->set_ptrdiff_t_typedef(decl);
        else if (name == size_t_)
            semaModel_->set_size_t_typedef(decl);
        else if (name == max_align_t_)
            semaModel_->set_max_align_t_typedef(decl);
        else if (name == wchar_t_)
            semaModel_->set_wchar_t_typedef(decl);
        else if (name == char16_t_)
            semaModel_->set_char16_t_typedef(decl);
        else if (name == char32_t_)
            semaModel_->set_char32_t_typedef(decl);
    }
    else {
        handleNonTypedefDeclarator(node);
        nameDeclarationAtTop(obtainName(node->identifierToken()));
    }

    VISIT(node->attributes_PostIdentifier());
    VISIT(node->initializer());

    return Action::Skip;
}